

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

void secp256k1_fe_impl_normalize_weak(secp256k1_fe *r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *in_RDI;
  uint64_t x;
  uint64_t t4;
  uint64_t t3;
  uint64_t t2;
  uint64_t t1;
  uint64_t t0;
  
  uVar1 = (in_RDI[4] >> 0x30) * 0x1000003d1 + *in_RDI;
  uVar2 = (uVar1 >> 0x34) + in_RDI[1];
  uVar3 = (uVar2 >> 0x34) + in_RDI[2];
  uVar4 = (uVar3 >> 0x34) + in_RDI[3];
  *in_RDI = uVar1 & 0xfffffffffffff;
  in_RDI[1] = uVar2 & 0xfffffffffffff;
  in_RDI[2] = uVar3 & 0xfffffffffffff;
  in_RDI[3] = uVar4 & 0xfffffffffffff;
  in_RDI[4] = (uVar4 >> 0x34) + (in_RDI[4] & 0xffffffffffff);
  return;
}

Assistant:

static void secp256k1_fe_impl_normalize_weak(secp256k1_fe *r) {
    uint64_t t0 = r->n[0], t1 = r->n[1], t2 = r->n[2], t3 = r->n[3], t4 = r->n[4];

    /* Reduce t4 at the start so there will be at most a single carry from the first pass */
    uint64_t x = t4 >> 48; t4 &= 0x0FFFFFFFFFFFFULL;

    /* The first pass ensures the magnitude is 1, ... */
    t0 += x * 0x1000003D1ULL;
    t1 += (t0 >> 52); t0 &= 0xFFFFFFFFFFFFFULL;
    t2 += (t1 >> 52); t1 &= 0xFFFFFFFFFFFFFULL;
    t3 += (t2 >> 52); t2 &= 0xFFFFFFFFFFFFFULL;
    t4 += (t3 >> 52); t3 &= 0xFFFFFFFFFFFFFULL;

    /* ... except for a possible carry at bit 48 of t4 (i.e. bit 256 of the field element) */
    VERIFY_CHECK(t4 >> 49 == 0);

    r->n[0] = t0; r->n[1] = t1; r->n[2] = t2; r->n[3] = t3; r->n[4] = t4;
}